

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_leaky_relu(ggml_context *ctx,ggml_tensor *a,float negative_slope,_Bool inplace)

{
  ggml_tensor *tensor;
  byte in_DL;
  ggml_tensor *in_RSI;
  undefined4 in_XMM0_Da;
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffffd8;
  ggml_context *in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe8;
  
  if ((in_DL & 1) == 0) {
    tensor = ggml_dup_tensor(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    tensor = ggml_view_tensor((ggml_context *)in_RSI,
                              (ggml_tensor *)
                              (CONCAT44(in_XMM0_Da,CONCAT13(in_DL,in_stack_ffffffffffffffe8)) &
                              0xffffffff01ffffff));
  }
  ggml_set_op_params(tensor,tensor,0x14c4a8);
  tensor->op = GGML_OP_LEAKY_RELU;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_leaky_relu(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        float                 negative_slope,
        bool                  inplace) {
    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    ggml_set_op_params(result, &negative_slope, sizeof(negative_slope));

    result->op     = GGML_OP_LEAKY_RELU;
    result->src[0] = a;

    return result;
}